

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_flush_vtlb_page_locked(CPUArchState_conflict28 *env,int mmu_idx,target_ulong_conflict page)

{
  _Bool _Var1;
  CPUTLB_conflict5 *pCVar2;
  int local_24;
  int k;
  CPUTLBDesc_conflict *d;
  target_ulong_conflict page_local;
  int mmu_idx_local;
  CPUArchState_conflict28 *env_local;
  
  pCVar2 = env_tlb(env);
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    _Var1 = tlb_flush_entry_locked(env->uc,pCVar2->d[mmu_idx].vtable + local_24,page);
    if (_Var1) {
      tlb_n_used_entries_dec(env,(long)mmu_idx);
    }
  }
  return;
}

Assistant:

static inline void tlb_flush_vtlb_page_locked(CPUArchState *env, int mmu_idx,
                                              target_ulong page)
{
    CPUTLBDesc *d = &env_tlb(env)->d[mmu_idx];
    int k;

    // assert_cpu_is_self(env_cpu(env));
    for (k = 0; k < CPU_VTLB_SIZE; k++) {
        if (tlb_flush_entry_locked(env->uc, &d->vtable[k], page)) {
            tlb_n_used_entries_dec(env, mmu_idx);
        }
    }
}